

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stepper.cpp
# Opt level: O0

void __thiscall QtMWidgets::Stepper::setWrapping(Stepper *this,bool enabled)

{
  StepperPrivate *pSVar1;
  byte local_22;
  bool needUpdate;
  bool enabled_local;
  Stepper *this_local;
  
  pSVar1 = QScopedPointer<QtMWidgets::StepperPrivate,_QScopedPointerDeleter<QtMWidgets::StepperPrivate>_>
           ::operator->(&this->d);
  pSVar1->wrapping = enabled;
  pSVar1 = QScopedPointer<QtMWidgets::StepperPrivate,_QScopedPointerDeleter<QtMWidgets::StepperPrivate>_>
           ::operator->(&this->d);
  if ((pSVar1->wrapping & 1U) != 0) {
    pSVar1 = QScopedPointer<QtMWidgets::StepperPrivate,_QScopedPointerDeleter<QtMWidgets::StepperPrivate>_>
             ::operator->(&this->d);
    local_22 = 1;
    if ((pSVar1->minusButtonEnabled & 1U) != 0) {
      pSVar1 = QScopedPointer<QtMWidgets::StepperPrivate,_QScopedPointerDeleter<QtMWidgets::StepperPrivate>_>
               ::operator->(&this->d);
      local_22 = pSVar1->plusButtonEnabled ^ 0xff;
    }
    pSVar1 = QScopedPointer<QtMWidgets::StepperPrivate,_QScopedPointerDeleter<QtMWidgets::StepperPrivate>_>
             ::operator->(&this->d);
    pSVar1->minusButtonEnabled = true;
    pSVar1 = QScopedPointer<QtMWidgets::StepperPrivate,_QScopedPointerDeleter<QtMWidgets::StepperPrivate>_>
             ::operator->(&this->d);
    pSVar1->plusButtonEnabled = true;
    if ((local_22 & 1) != 0) {
      QWidget::update();
    }
  }
  return;
}

Assistant:

void
Stepper::setWrapping( bool enabled )
{
	d->wrapping = enabled;

	if( d->wrapping )
	{
		const bool needUpdate = !d->minusButtonEnabled || !d->plusButtonEnabled;

		d->minusButtonEnabled = true;
		d->plusButtonEnabled = true;

		if( needUpdate )
			update();
	}
}